

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *this;
  float *pfVar1;
  bool *pbVar2;
  int *piVar3;
  ImVec2 *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar60;
  undefined8 uVar61;
  ImGuiID IVar7;
  ImGuiID IVar8;
  ImFontAtlas *pIVar9;
  char *pcVar10;
  value_type pIVar11;
  bool bVar12;
  undefined1 auVar13 [12];
  ulong uVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiID IVar18;
  bool bVar19;
  bool bVar20;
  int n;
  ImGuiInputSource IVar21;
  value_type *ppIVar22;
  long lVar23;
  ImFont *font;
  ImGuiNavMoveResult *pIVar24;
  value_type *pvVar25;
  ImGuiWindow *pIVar26;
  value_type *ppIVar27;
  int i_1;
  ImGuiWindow *pIVar28;
  ImGuiInputReadMode extraout_EDX;
  ImGuiInputReadMode extraout_EDX_00;
  ImGuiInputReadMode extraout_EDX_01;
  ImGuiInputReadMode mode;
  ImGuiWindow *parent_window;
  ImGuiWindow *new_nav_window;
  int i_2;
  int iVar29;
  float *pfVar30;
  ImGuiWindow *pIVar31;
  float *pfVar32;
  ImGuiID IVar33;
  ImGuiID IVar34;
  ImGuiWindow *old_nav_window;
  ImGuiID IVar35;
  ImGuiContext *g;
  ImGuiNavMoveResult *pIVar36;
  byte bVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  ImVec2 IVar41;
  ImVec2 IVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  undefined1 auVar50 [16];
  float fVar51;
  ImVec2 IVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ImRect IVar59;
  ImRect rect_abs;
  ImVec2 local_38;
  
  pIVar15 = GImGui;
  bVar37 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd96,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9b,"void ImGui::NewFrame()");
  }
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9c,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9d,"void ImGui::NewFrame()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if ((pIVar9->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  ppIVar22 = ImVector<ImFont_*>::operator[](&pIVar9->Fonts,0);
  if ((*ppIVar22)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9f,"void ImGui::NewFrame()");
  }
  if ((pIVar15->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda0,"void ImGui::NewFrame()");
  }
  fVar51 = (pIVar15->Style).Alpha;
  if ((fVar51 < 0.0) || (1.0 < fVar51)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda1,"void ImGui::NewFrame()");
  }
  if ((pIVar15->FrameCount != 0) && (pIVar15->FrameCountEnded != pIVar15->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda2,"void ImGui::NewFrame()");
  }
  lVar23 = 0;
  while (lVar23 != 0x15) {
    piVar3 = (pIVar15->IO).KeyMap + lVar23;
    lVar23 = lVar23 + 1;
    if (0x200 < *piVar3 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xda4,"void ImGui::NewFrame()");
    }
  }
  if ((((pIVar15->IO).ConfigFlags & 1) != 0) && ((pIVar15->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda8,"void ImGui::NewFrame()");
  }
  if (pIVar15->SettingsLoaded == false) {
    if ((pIVar15->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xdad,"void ImGui::NewFrame()");
    }
    pcVar10 = (pIVar15->IO).IniFilename;
    if (pcVar10 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar10);
    }
    pIVar15->SettingsLoaded = true;
  }
  fVar51 = (pIVar15->IO).DeltaTime;
  if ((0.0 < pIVar15->SettingsDirtyTimer) &&
     (fVar46 = pIVar15->SettingsDirtyTimer - fVar51, pIVar15->SettingsDirtyTimer = fVar46,
     fVar46 <= 0.0)) {
    pcVar10 = (pIVar15->IO).IniFilename;
    if (pcVar10 == (char *)0x0) {
      (pIVar15->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar10);
      fVar51 = (pIVar15->IO).DeltaTime;
    }
    pIVar15->SettingsDirtyTimer = 0.0;
  }
  pIVar15->Time = fVar51 + pIVar15->Time;
  pIVar15->FrameCount = pIVar15->FrameCount + 1;
  pIVar15->TooltipOverrideCount = 0;
  pIVar15->WindowsActiveCount = 0;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar15->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xdc7,"void ImGui::NewFrame()");
  }
  fVar51 = (pIVar15->IO).DisplaySize.x;
  fVar46 = (pIVar15->IO).DisplaySize.y;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.z = fVar51;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.w = fVar46;
  (pIVar15->DrawListSharedData).CurveTessellationTol = (pIVar15->Style).CurveTessellationTol;
  this = &pIVar15->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,((pIVar15->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar15->OverlayDrawList).Flags =
       (uint)(pIVar15->Style).AntiAliasedLines + (uint)(pIVar15->Style).AntiAliasedFill * 2;
  (pIVar15->DrawData).Valid = false;
  (pIVar15->DrawData).TotalVtxCount = 0;
  (pIVar15->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar15->DrawData).CmdListsCount = 0;
  (pIVar15->DrawData).TotalIdxCount = 0;
  if (pIVar15->HoveredIdPreviousFrame == 0) {
    pIVar15->HoveredIdTimer = 0.0;
  }
  pIVar15->HoveredIdPreviousFrame = pIVar15->HoveredId;
  pIVar15->HoveredId = 0;
  pIVar15->HoveredIdAllowOverlap = false;
  if ((pIVar15->ActiveIdIsAlive == false) &&
     (pIVar15->ActiveId != 0 && pIVar15->ActiveIdPreviousFrame == pIVar15->ActiveId)) {
    ClearActiveID();
  }
  IVar7 = pIVar15->ActiveId;
  if (IVar7 != 0) {
    pIVar15->ActiveIdTimer = (pIVar15->IO).DeltaTime + pIVar15->ActiveIdTimer;
  }
  pIVar15->ActiveIdPreviousFrame = IVar7;
  pIVar15->ActiveIdIsAlive = false;
  pIVar15->ActiveIdIsJustActivated = false;
  if (IVar7 != pIVar15->ScalarAsInputTextId && pIVar15->ScalarAsInputTextId != 0) {
    pIVar15->ScalarAsInputTextId = 0;
  }
  if ((pIVar15->DragDropActive == true) &&
     ((pIVar15->DragDropPayload).DataFrameCount + 1 < pIVar15->FrameCount)) {
    ClearDragDrop();
    ImVector<unsigned_char>::clear(&pIVar15->DragDropPayloadBufHeap);
    pIVar15->DragDropPayloadBufLocal[0] = '\0';
    pIVar15->DragDropPayloadBufLocal[1] = '\0';
    pIVar15->DragDropPayloadBufLocal[2] = '\0';
    pIVar15->DragDropPayloadBufLocal[3] = '\0';
    pIVar15->DragDropPayloadBufLocal[4] = '\0';
    pIVar15->DragDropPayloadBufLocal[5] = '\0';
    pIVar15->DragDropPayloadBufLocal[6] = '\0';
    pIVar15->DragDropPayloadBufLocal[7] = '\0';
  }
  pIVar15->DragDropAcceptIdPrev = pIVar15->DragDropAcceptIdCurr;
  pIVar15->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar15->DragDropAcceptIdCurr = 0;
  pfVar1 = (pIVar15->IO).KeysDownDuration;
  memcpy((pIVar15->IO).KeysDownDurationPrev,pfVar1,0x800);
  for (lVar23 = 0; pIVar16 = GImGui, lVar23 != 0x200; lVar23 = lVar23 + 1) {
    fVar51 = -1.0;
    if ((pIVar15->IO).KeysDown[lVar23] == true) {
      fVar51 = 0.0;
      if (0.0 <= pfVar1[lVar23]) {
        fVar51 = pfVar1[lVar23] + (pIVar15->IO).DeltaTime;
      }
    }
    pfVar1[lVar23] = fVar51;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar38 = (pIVar16->IO).ConfigFlags;
  if ((((uVar38 & 2) != 0) && (((pIVar16->IO).BackendFlags & 1) != 0)) &&
     ((0.0 < (pIVar16->IO).NavInputs[0] ||
      (((0.0 < (pIVar16->IO).NavInputs[2] || (0.0 < (pIVar16->IO).NavInputs[1])) ||
       (0.0 < (pIVar16->IO).NavInputs[3])))))) {
    pIVar16->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar38 & 1) != 0) {
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[0xc]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[0] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[0xd]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[2] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[0xe]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[1] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[1]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[0x11] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[2]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[0x12] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[3]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[0x13] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar19 = IsKeyDown((pIVar16->IO).KeyMap[4]);
    if (bVar19) {
      (pIVar16->IO).NavInputs[0x14] = 1.0;
      pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    if ((pIVar16->IO).KeyCtrl == true) {
      (pIVar16->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar16->IO).KeyShift == true) {
      (pIVar16->IO).NavInputs[0xf] = 1.0;
    }
    if ((pIVar16->IO).KeyAlt == true) {
      (pIVar16->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar1 = (pIVar16->IO).NavInputsDownDuration;
  pfVar30 = pfVar1;
  pfVar32 = (pIVar16->IO).NavInputsDownDurationPrev;
  for (lVar23 = 0x15; lVar23 != 0; lVar23 = lVar23 + -1) {
    *pfVar32 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar37 * -2 + 1;
    pfVar32 = pfVar32 + (ulong)bVar37 * -2 + 1;
  }
  for (lVar23 = 0; lVar23 != 0x15; lVar23 = lVar23 + 1) {
    fVar51 = -1.0;
    if (0.0 < (pIVar16->IO).NavInputs[lVar23]) {
      fVar51 = 0.0;
      if (0.0 <= pfVar1[lVar23]) {
        fVar51 = pfVar1[lVar23] + (pIVar16->IO).DeltaTime;
      }
    }
    pfVar1[lVar23] = fVar51;
  }
  IVar7 = pIVar16->NavInitResultId;
  if ((IVar7 != 0) &&
     ((pIVar16->NavDisableHighlight != true || (pIVar16->NavInitRequestFromMove == true)))) {
    if (pIVar16->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc08,"void ImGui::NavUpdate()");
    }
    if (pIVar16->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar7,pIVar16->NavLayer,&pIVar16->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar7,pIVar16->NavLayer);
    }
    IVar42 = (pIVar16->NavInitResultRectRel).Max;
    pIVar4 = &pIVar16->NavWindow->NavRectRel[pIVar16->NavLayer].Min;
    *pIVar4 = (pIVar16->NavInitResultRectRel).Min;
    pIVar4[1] = IVar42;
  }
  pIVar16->NavInitRequest = false;
  pIVar16->NavInitRequestFromMove = false;
  pIVar16->NavInitResultId = 0;
  pIVar16->NavJustMovedToId = 0;
  if (pIVar16->NavMoveRequest == true) {
    pIVar36 = &pIVar16->NavMoveResultOther;
    IVar7 = (pIVar16->NavMoveResultOther).ID;
    if ((pIVar16->NavMoveResultLocal).ID == 0) {
      pIVar24 = pIVar36;
      if (IVar7 != 0) goto LAB_0016f7cc;
    }
    else {
      pIVar24 = &pIVar16->NavMoveResultLocal;
      if (IVar7 == 0) {
        pIVar26 = pIVar16->NavWindow;
LAB_0016f7ef:
        pIVar28 = pIVar26;
        pIVar36 = pIVar24;
      }
      else {
LAB_0016f7cc:
        pIVar26 = pIVar16->NavWindow;
        pIVar28 = ((pIVar16->NavMoveResultOther).Window)->ParentWindow;
        if (pIVar28 != pIVar26) goto LAB_0016f7ef;
        fVar51 = (pIVar16->NavMoveResultLocal).DistBox;
        fVar46 = (pIVar16->NavMoveResultOther).DistBox;
        if ((fVar51 <= fVar46) &&
           (((pIVar26 = pIVar28, fVar46 != fVar51 || (NAN(fVar46) || NAN(fVar51))) ||
            (fVar51 = (pIVar16->NavMoveResultLocal).DistCenter,
            pfVar1 = &(pIVar16->NavMoveResultOther).DistCenter,
            fVar51 < *pfVar1 || fVar51 == *pfVar1)))) goto LAB_0016f7ef;
      }
      if ((pIVar28 == (ImGuiWindow *)0x0) ||
         (pIVar26 = pIVar36->Window, pIVar26 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xc1d,"void ImGui::NavUpdate()");
      }
      if (pIVar16->NavLayer == 0) {
        IVar42 = (pIVar36->RectRel).Min;
        IVar41 = (pIVar36->RectRel).Max;
        fVar51 = (pIVar26->Pos).x;
        rect_abs.Min.x = IVar42.x + fVar51;
        fVar46 = (pIVar26->Pos).y;
        rect_abs.Min.y = IVar42.y + fVar46;
        rect_abs.Max.x = IVar41.x + fVar51;
        rect_abs.Max.y = IVar41.y + fVar46;
        NavScrollToBringItemIntoView(pIVar26,&rect_abs);
        pIVar26 = pIVar36->Window;
        if ((pIVar26->Flags & 0x1000000) != 0) {
          NavScrollToBringItemIntoView(pIVar26->ParentWindow,&rect_abs);
          pIVar26 = pIVar36->Window;
        }
        IVar41 = CalcNextScrollFromScrollTargetAndClamp(pIVar26,false);
        IVar42 = pIVar36->Window->Scroll;
        local_38.x = IVar42.x - IVar41.x;
        local_38.y = IVar42.y - IVar41.y;
        ImRect::Translate(&pIVar36->RectRel,&local_38);
      }
      ClearActiveID();
      pIVar16->NavWindow = pIVar36->Window;
      SetNavIDWithRectRel(pIVar36->ID,pIVar16->NavLayer,&pIVar36->RectRel);
      pIVar16->NavJustMovedToId = pIVar36->ID;
      pIVar16->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar16->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar16->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc37,"void ImGui::NavUpdate()");
    }
    if (((pIVar16->NavMoveResultLocal).ID == 0) && ((pIVar16->NavMoveResultOther).ID == 0)) {
      pIVar16->NavDisableHighlight = false;
    }
    pIVar16->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar16->NavMousePosDirty == true) && (pIVar16->NavIdIsAlive == true)) {
    if ((((pIVar16->IO).ConfigFlags & 4) != 0) && (((pIVar16->IO).BackendFlags & 4) != 0)) {
      if ((pIVar16->NavDisableHighlight != false) || (pIVar16->NavDisableMouseHover == false)) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xc43,"void ImGui::NavUpdate()");
      }
      IVar42 = NavCalcPreferredRefPos();
      (pIVar16->IO).MousePosPrev = IVar42;
      (pIVar16->IO).MousePos = IVar42;
      (pIVar16->IO).WantSetMousePos = true;
    }
    pIVar16->NavMousePosDirty = false;
  }
  pIVar16->NavIdIsAlive = false;
  pIVar16->NavJustTabbedId = 0;
  uVar38 = pIVar16->NavLayer;
  if (1 < uVar38) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc4b,"void ImGui::NavUpdate()");
  }
  pIVar26 = pIVar16->NavWindow;
  pIVar28 = pIVar26;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    for (; pIVar28 != (ImGuiWindow *)0x0; pIVar28 = pIVar28->ParentWindow) {
      if ((pIVar28->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar28 != pIVar26) {
          pIVar28->NavLastChildNavWindow = pIVar26;
        }
        break;
      }
    }
    if ((uVar38 == 0) && (pIVar26->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar26->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar17 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    bVar19 = IsNavInputPressed(3,ImGuiInputReadMode_Pressed);
    if (((pIVar17->IO).KeyCtrl == true) && (bVar20 = IsKeyPressedMap(0,true), bVar20)) {
      bVar37 = (byte)(pIVar17->IO).ConfigFlags;
      uVar38 = (uint)bVar37;
      if (bVar19 || (bVar37 & 1) != 0) {
LAB_0016fa2a:
        pIVar26 = pIVar17->NavWindow;
        if ((pIVar26 != (ImGuiWindow *)0x0) ||
           (pIVar26 = FindWindowNavigable((pIVar17->Windows).Size + -1,-0x7fffffff,-1),
           pIVar26 != (ImGuiWindow *)0x0)) {
          pIVar17->NavWindowingTarget = pIVar26->RootWindowForTabbing;
          pIVar17->NavWindowingHighlightTimer = 0.0;
          pIVar17->NavWindowingHighlightAlpha = 0.0;
          pIVar17->NavWindowingToggleLayer = (bool)(~(byte)uVar38 & 1);
          pIVar17->NavInputSource = ImGuiInputSource_NavGamepad - (uVar38 & 1);
        }
      }
    }
    else if (bVar19) {
      uVar38 = 0;
      goto LAB_0016fa2a;
    }
    bVar19 = pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = false;
  }
  fVar51 = (pIVar17->IO).DeltaTime + pIVar17->NavWindowingHighlightTimer;
  pIVar17->NavWindowingHighlightTimer = fVar51;
  if (bVar19) {
LAB_0016fc5f:
    bVar19 = false;
    pIVar26 = (ImGuiWindow *)0x0;
  }
  else {
    IVar21 = pIVar17->NavInputSource;
    if (IVar21 != ImGuiInputSource_NavGamepad) {
LAB_0016fbd2:
      if (IVar21 == ImGuiInputSource_NavKeyboard) {
        fVar46 = (pIVar17->NavWindowingHighlightTimer + -0.15) / 0.04;
        fVar51 = 1.0;
        if (fVar46 <= 1.0) {
          fVar51 = fVar46;
        }
        fVar51 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar51);
        uVar38 = -(uint)(fVar51 <= pIVar17->NavWindowingHighlightAlpha);
        pIVar17->NavWindowingHighlightAlpha =
             (float)(uVar38 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar38 & (uint)fVar51);
        bVar19 = IsKeyPressedMap(0,true);
        if (bVar19) {
          NavUpdateWindowingHighlightWindow((pIVar17->IO).KeyShift - 1 | 1);
        }
        if ((pIVar17->IO).KeyCtrl == false) {
          pIVar26 = pIVar17->NavWindowingTarget;
          bVar19 = false;
          goto LAB_0016fc64;
        }
      }
      goto LAB_0016fc5f;
    }
    fVar46 = (fVar51 + -0.2) / 0.05;
    fVar51 = 1.0;
    if (fVar46 <= 1.0) {
      fVar51 = fVar46;
    }
    fVar51 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar51);
    uVar38 = -(uint)(fVar51 <= pIVar17->NavWindowingHighlightAlpha);
    fVar51 = (float)(uVar38 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar38 & (uint)fVar51);
    pIVar17->NavWindowingHighlightAlpha = fVar51;
    bVar19 = IsNavInputPressed(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar20 = IsNavInputPressed(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar19 - (uint)bVar20 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar19 - (uint)bVar20);
      pIVar17->NavWindowingHighlightAlpha = 1.0;
      fVar51 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0016fc5f;
      IVar21 = pIVar17->NavInputSource;
      goto LAB_0016fbd2;
    }
    pbVar2 = &pIVar17->NavWindowingToggleLayer;
    *pbVar2 = (bool)(*pbVar2 & fVar51 < 1.0);
    if (*pbVar2 == false) {
      pIVar26 = pIVar17->NavWindowingTarget;
      bVar19 = false;
    }
    else {
      bVar19 = pIVar17->NavWindow != (ImGuiWindow *)0x0;
      pIVar26 = (ImGuiWindow *)0x0;
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0016fc64:
  if (((pIVar17->ActiveId == 0) || (pIVar17->ActiveIdAllowOverlap == true)) &&
     (bVar20 = IsNavInputPressed(0x10,ImGuiInputReadMode_Released), bVar20)) {
    if (-256000.0 <= (pIVar17->IO).MousePos.x) {
      bVar20 = -256000.0 <= (pIVar17->IO).MousePos.y;
    }
    else {
      bVar20 = false;
    }
    if (-256000.0 <= (pIVar17->IO).MousePosPrev.x) {
      bVar12 = -256000.0 <= (pIVar17->IO).MousePosPrev.y;
    }
    else {
      bVar12 = false;
    }
    bVar19 = (bool)(bVar19 | bVar20 ^ bVar12 ^ 1U);
  }
  pIVar28 = pIVar17->NavWindowingTarget;
  if ((pIVar28 != (ImGuiWindow *)0x0) && ((pIVar28->Flags & 4) == 0)) {
    IVar21 = pIVar17->NavInputSource;
    if (IVar21 == ImGuiInputSource_NavGamepad) {
LAB_0016fd1b:
      IVar42 = GetNavInputAmount2d(IVar21,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar42.x = 0.0;
      IVar42.y = 0.0;
      if ((IVar21 == ImGuiInputSource_NavKeyboard) && ((pIVar17->IO).KeyShift == false)) {
        IVar21 = ImGuiInputSource_Mouse;
        goto LAB_0016fd1b;
      }
    }
    fVar51 = IVar42.y;
    if (((IVar42.x != 0.0) || (fVar51 != 0.0)) || (NAN(fVar51))) {
      fVar46 = (pIVar17->IO).DisplayFramebufferScale.x;
      fVar40 = (pIVar17->IO).DisplayFramebufferScale.y;
      if (fVar40 <= fVar46) {
        fVar46 = fVar40;
      }
      fVar46 = (float)(int)(fVar46 * (pIVar17->IO).DeltaTime * 800.0);
      IVar41.x = (pIVar28->Pos).x + IVar42.x * fVar46;
      IVar41.y = (pIVar28->Pos).y + fVar51 * fVar46;
      pIVar28->Pos = IVar41;
      pIVar17->NavDisableMouseHover = true;
      MarkIniSettingsDirty(pIVar28);
    }
  }
  if (pIVar26 != (ImGuiWindow *)0x0) {
    if ((pIVar17->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar26 != pIVar17->NavWindow->RootWindowForTabbing)) {
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
      pIVar28 = pIVar26->NavLastChildNavWindow;
      if (pIVar26->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pIVar28 = pIVar26;
      }
      ClosePopupsOverWindow(pIVar28);
      FocusWindow(pIVar28);
      if (pIVar28->NavLastIds[0] == 0) {
        NavInitWindow(pIVar28,false);
      }
      if ((pIVar28->DC).NavLayerActiveMask == 2) {
        pIVar17->NavLayer = 1;
      }
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar19) && (pIVar26 = pIVar17->NavWindow, pIVar28 = pIVar26, pIVar26 != (ImGuiWindow *)0x0))
  {
    for (; (((pIVar28->DC).NavLayerActiveMask & 2) == 0 &&
           ((pIVar28->Flags & 0x15000000U) == 0x1000000)); pIVar28 = pIVar28->ParentWindow) {
    }
    if (pIVar28 != pIVar26) {
      FocusWindow(pIVar28);
      pIVar28->NavLastChildNavWindow = pIVar26;
      pIVar26 = pIVar17->NavWindow;
    }
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
    uVar38 = 0;
    if (((pIVar26->DC).NavLayerActiveMask & 2) != 0) {
      uVar38 = pIVar17->NavLayer ^ 1;
    }
    NavRestoreLayer(uVar38);
  }
  uVar38 = (pIVar16->IO).ConfigFlags;
  if ((uVar38 & 2) == 0) {
    bVar37 = 0;
  }
  else {
    bVar37 = (byte)(pIVar16->IO).BackendFlags & 1;
  }
  if ((((uVar38 & 1) == 0) && (bVar37 == 0)) || (pIVar16->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar16->IO).NavActive = false;
LAB_0016fed6:
    bVar19 = true;
    if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar19 = pIVar16->NavInitRequest;
    }
  }
  else {
    bVar19 = (pIVar16->NavWindow->Flags & 0x40000U) == 0;
    (pIVar16->IO).NavActive = bVar19;
    if (((!bVar19) || (pIVar16->NavId == 0)) ||
       (bVar19 = true, pIVar16->NavDisableHighlight != false)) goto LAB_0016fed6;
  }
  (pIVar16->IO).NavVisible = bVar19;
  bVar19 = IsNavInputPressed(1,ImGuiInputReadMode_Pressed);
  if (bVar19) {
    if (pIVar16->ActiveId == 0) {
      pIVar26 = pIVar16->NavWindow;
      if (((pIVar26 == (ImGuiWindow *)0x0) || ((pIVar26->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar26->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar16->OpenPopupStack).Size < 1) {
          if (pIVar16->NavLayer == 0) {
            if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x5000000U) != 0x1000000)) {
              pIVar26->NavLastIds[0] = 0;
            }
            pIVar16->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else {
          pvVar25 = ImVector<ImGuiPopupRef>::back(&pIVar16->OpenPopupStack);
          if ((pvVar25->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar16->OpenPopupStack).Size + -1);
          }
        }
      }
      else {
        if (pIVar26->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0xc67,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar26->ParentWindow);
        SetNavID(pIVar26->ChildId,0);
        pIVar16->NavIdIsAlive = false;
        if (pIVar16->NavDisableMouseHover == true) {
          pIVar16->NavMousePosDirty = true;
        }
      }
    }
    else {
      ClearActiveID();
    }
  }
  pIVar16->NavActivateId = 0;
  pIVar16->NavActivateDownId = 0;
  pIVar16->NavActivatePressedId = 0;
  pIVar16->NavInputId = 0;
  IVar7 = pIVar16->NavId;
  IVar35 = 0;
  if ((IVar7 == 0) || (pIVar16->NavDisableHighlight != false)) {
    IVar33 = 0;
    IVar35 = 0;
LAB_0016ff57:
    pIVar26 = pIVar16->NavWindow;
    bVar19 = pIVar26 == (ImGuiWindow *)0x0;
    if ((!bVar19) && ((pIVar26->Flags & 0x40000) != 0)) {
      pIVar16->NavDisableHighlight = true;
    }
    if (IVar35 != IVar33 && IVar33 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc94,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar33 = 0;
    if (pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0016ff57;
    IVar35 = 0;
    if (pIVar16->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar16->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar19 = IsNavInputPressed(0,ImGuiInputReadMode_Pressed);
          IVar8 = pIVar16->ActiveId;
          IVar18 = IVar7;
          if (IVar8 == 0 && bVar19) {
            pIVar16->NavActivateId = IVar7;
            pIVar16->NavActivateDownId = IVar7;
            IVar34 = IVar7;
LAB_0017040b:
            pIVar16->NavActivatePressedId = IVar7;
          }
          else if (IVar8 == 0) {
            pIVar16->NavActivateDownId = IVar7;
            IVar34 = 0;
            if (bVar19) goto LAB_0017040b;
          }
          else {
            IVar35 = 0;
            IVar34 = 0;
            IVar33 = 0;
            if (IVar8 != IVar7) goto LAB_0016ff57;
            pIVar16->NavActivateDownId = IVar7;
            if (bVar19 && IVar8 == IVar7) goto LAB_0017040b;
          }
LAB_00170416:
          IVar33 = IVar34;
          IVar35 = IVar18;
          bVar19 = IsNavInputPressed(2,ImGuiInputReadMode_Pressed);
          if (bVar19) {
            pIVar16->NavInputId = IVar7;
          }
        }
        else {
          IVar35 = 0;
          IVar18 = 0;
          IVar34 = 0;
          if (pIVar16->ActiveId == IVar7 || pIVar16->ActiveId == 0) goto LAB_00170416;
        }
      }
      goto LAB_0016ff57;
    }
    bVar19 = true;
    pIVar26 = (ImGuiWindow *)0x0;
  }
  pIVar16->NavMoveRequest = false;
  IVar35 = pIVar16->NavNextActivateId;
  if (IVar35 != 0) {
    pIVar16->NavActivateId = IVar35;
    pIVar16->NavActivateDownId = IVar35;
    pIVar16->NavActivatePressedId = IVar35;
    pIVar16->NavInputId = IVar35;
  }
  pIVar16->NavNextActivateId = 0;
  if (pIVar16->ActiveId == 0) {
    uVar38 = 0xffffffff;
  }
  else {
    uVar38 = pIVar16->ActiveIdAllowNavDirFlags;
  }
  if (pIVar16->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar16->NavMoveDir = -1;
    pIVar16->NavMoveRequestFlags = 0;
    if (((!bVar19) &&
        (bVar19 = pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0,
        mode = (ImGuiInputReadMode)(uVar38 != 0 && bVar19), uVar38 != 0 && bVar19)) &&
       ((pIVar26->Flags & 0x40000) == 0)) {
      iVar29 = -1;
      if (((uVar38 & 1) != 0) &&
         (bVar19 = IsNavInputPressedAnyOfTwo(4,0x11,mode), mode = extraout_EDX, bVar19)) {
        pIVar16->NavMoveDir = 0;
        iVar29 = 0;
      }
      if (((uVar38 & 2) != 0) &&
         (bVar19 = IsNavInputPressedAnyOfTwo(5,0x12,mode), mode = extraout_EDX_00, bVar19)) {
        pIVar16->NavMoveDir = 1;
        iVar29 = 1;
      }
      if (((uVar38 & 4) != 0) &&
         (bVar19 = IsNavInputPressedAnyOfTwo(6,0x13,mode), mode = extraout_EDX_01, bVar19)) {
        iVar29 = 2;
        pIVar16->NavMoveDir = 2;
      }
      if (((uVar38 & 8) == 0) || (bVar19 = IsNavInputPressedAnyOfTwo(7,0x14,mode), !bVar19)) {
        pIVar16->NavMoveClipDir = iVar29;
        if (iVar29 == -1) goto LAB_00170143;
      }
      else {
        iVar29 = 3;
        pIVar16->NavMoveDir = 3;
        pIVar16->NavMoveClipDir = 3;
      }
      goto LAB_0017001a;
    }
    pIVar16->NavMoveClipDir = -1;
  }
  else {
    iVar29 = pIVar16->NavMoveDir;
    if ((iVar29 == -1) || (pIVar16->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcaf,"void ImGui::NavUpdate()");
    }
    if (pIVar16->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcb0,"void ImGui::NavUpdate()");
    }
    pIVar16->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
LAB_0017001a:
    pIVar16->NavMoveRequest = true;
    pIVar16->NavMoveDirLast = iVar29;
    if (IVar7 == 0) {
      pIVar16->NavInitRequest = true;
      pIVar16->NavInitRequestFromMove = true;
      pIVar16->NavInitResultId = 0;
      pIVar16->NavDisableHighlight = false;
    }
  }
LAB_00170143:
  NavUpdateAnyRequestFlag();
  pIVar26 = pIVar16->NavWindow;
  if (((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x40000) == 0)) &&
     (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar51 = (float)(int)(GImGui->FontBaseSize * pIVar26->FontWindowScale * 100.0 *
                          (pIVar16->IO).DeltaTime + 0.5);
    if ((((pIVar26->DC).NavLayerActiveMask == 0) && ((pIVar26->DC).NavHasScroll == true)) &&
       (pIVar16->NavMoveRequest == true)) {
      uVar38 = pIVar16->NavMoveDir;
      if (uVar38 < 2) {
        fVar46 = (pIVar26->Scroll).x;
        fVar40 = (pIVar26->DC).CursorMaxPos.x;
        fVar47 = (float)(int)(*(float *)(&DAT_001caab8 + (ulong)(uVar38 == 0) * 4) * fVar51 + fVar46
                             );
        (pIVar26->Scroll).x = fVar47;
        (pIVar26->DC).CursorMaxPos.x = (fVar46 + fVar40) - fVar47;
      }
      else if ((uVar38 & 0xfffffffe) == 2) {
        fVar46 = (pIVar26->Scroll).y;
        fVar40 = (pIVar26->DC).CursorMaxPos.y;
        fVar47 = (float)(int)(*(float *)(&DAT_001caab8 + (ulong)(uVar38 == 2) * 4) * fVar51 + fVar46
                             );
        (pIVar26->Scroll).y = fVar47;
        (pIVar26->DC).CursorMaxPos.y = (fVar46 + fVar40) - fVar47;
      }
    }
    IVar42 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar46 = IVar42.x;
    fVar40 = IVar42.y;
    if (((fVar46 != 0.0) || (NAN(fVar46))) && (pIVar26->ScrollbarX == true)) {
      fVar47 = (pIVar26->Scroll).x;
      fVar55 = (float)(int)(fVar46 * fVar51 + fVar47);
      fVar46 = (pIVar26->DC).CursorMaxPos.x;
      (pIVar26->Scroll).x = fVar55;
      (pIVar26->DC).CursorMaxPos.x = (fVar47 + fVar46) - fVar55;
      pIVar16->NavMoveFromClampedRefRect = true;
    }
    if ((fVar40 != 0.0) || (NAN(fVar40))) {
      fVar46 = (pIVar26->Scroll).y;
      fVar40 = (float)(int)(fVar40 * fVar51 + fVar46);
      fVar51 = (pIVar26->DC).CursorMaxPos.y;
      (pIVar26->Scroll).y = fVar40;
      (pIVar26->DC).CursorMaxPos.y = (fVar46 + fVar51) - fVar40;
      pIVar16->NavMoveFromClampedRefRect = true;
    }
  }
  ImGuiNavMoveResult::Clear(&pIVar16->NavMoveResultLocal);
  ImGuiNavMoveResult::Clear(&pIVar16->NavMoveResultOther);
  if (((pIVar16->NavMoveRequest == true) && (pIVar16->NavMoveFromClampedRefRect == true)) &&
     (pIVar16->NavLayer == 0)) {
    pIVar26 = pIVar16->NavWindow;
    IVar42 = (pIVar26->InnerMainRect).Min;
    fVar51 = (pIVar26->Pos).x;
    fVar46 = (pIVar26->Pos).y;
    IVar41 = (pIVar26->InnerMainRect).Max;
    rect_abs.Min.x = (IVar42.x - fVar51) + -1.0;
    rect_abs.Min.y = (IVar42.y - fVar46) + -1.0;
    rect_abs.Max.x = (IVar41.x - fVar51) + 1.0;
    rect_abs.Max.y = (IVar41.y - fVar46) + 1.0;
    bVar19 = ImRect::Contains(&rect_abs,pIVar26->NavRectRel);
    if (!bVar19) {
      auVar54._0_4_ = GImGui->FontBaseSize * pIVar26->FontWindowScale * 0.5;
      auVar53._0_4_ = rect_abs.Max.x - rect_abs.Min.x;
      auVar53._4_4_ = rect_abs.Max.y - rect_abs.Min.y;
      auVar53._8_4_ = rect_abs.Max.x - rect_abs.Max.x;
      auVar53._12_4_ = rect_abs.Max.y - rect_abs.Max.y;
      auVar54._4_4_ = auVar54._0_4_;
      auVar54._8_4_ = auVar54._0_4_;
      auVar54._12_4_ = auVar54._0_4_;
      auVar54 = minps(auVar53,auVar54);
      rect_abs.Min.x = auVar54._0_4_ + rect_abs.Min.x;
      rect_abs.Min.y = auVar54._4_4_ + rect_abs.Min.y;
      rect_abs.Max.x = rect_abs.Max.x - auVar54._0_4_;
      rect_abs.Max.y = rect_abs.Max.y - auVar54._4_4_;
      ImRect::ClipWith(pIVar26->NavRectRel + pIVar16->NavLayer,&rect_abs);
      pIVar16->NavId = 0;
    }
    pIVar16->NavMoveFromClampedRefRect = false;
  }
  pIVar26 = pIVar16->NavWindow;
  if (pIVar26 == (ImGuiWindow *)0x0) {
    IVar59 = GetViewportRect();
  }
  else {
    IVar42 = pIVar26->NavRectRel[pIVar16->NavLayer].Min;
    IVar41 = pIVar26->NavRectRel[pIVar16->NavLayer].Max;
    IVar48.x = 0.0;
    IVar48.y = 0.0;
    IVar43.x = 0.0;
    IVar43.y = 0.0;
    if (IVar42.y <= IVar41.y && IVar42.x <= IVar41.x) {
      IVar43 = IVar42;
      IVar48 = IVar41;
    }
    fVar51 = (pIVar26->Pos).x;
    fVar46 = (pIVar26->Pos).y;
    IVar59.Min.y = IVar43.y + fVar46;
    IVar59.Min.x = IVar43.x + fVar51;
    IVar59.Max.y = IVar48.y + fVar46;
    IVar59.Max.x = IVar48.x + fVar51;
  }
  pIVar16->NavScoringRectScreen = IVar59;
  fVar51 = IVar59.Min.x + 1.0;
  if (IVar59.Max.x <= fVar51) {
    fVar51 = IVar59.Max.x;
  }
  (pIVar16->NavScoringRectScreen).Min.x = fVar51;
  (pIVar16->NavScoringRectScreen).Max.x = fVar51;
  if (IVar59.Max.y < IVar59.Min.y) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xcf9,"void ImGui::NavUpdate()");
  }
  pIVar16->NavScoringCount = 0;
  pIVar16 = GImGui;
  fVar51 = (GImGui->IO).MousePos.x;
  if (((fVar51 < -256000.0) || (fVar46 = (GImGui->IO).MousePos.y, fVar46 < -256000.0)) ||
     ((fVar40 = (GImGui->IO).MousePosPrev.x, fVar40 < -256000.0 ||
      (fVar47 = (GImGui->IO).MousePosPrev.y, fVar47 < -256000.0)))) {
    (pIVar16->IO).MouseDelta.x = 0.0;
    (pIVar16->IO).MouseDelta.y = 0.0;
  }
  else {
    fVar51 = fVar51 - fVar40;
    fVar46 = fVar46 - fVar47;
    IVar52.y = fVar46;
    IVar52.x = fVar51;
    (GImGui->IO).MouseDelta = IVar52;
    if (((fVar51 != 0.0) || (fVar46 != 0.0)) || (NAN(fVar46))) {
      pIVar16->NavDisableMouseHover = false;
    }
  }
  IVar42 = (pIVar16->IO).MousePos;
  (pIVar16->IO).MousePosPrev = IVar42;
  for (lVar23 = 0x40a; lVar23 != 0x40f; lVar23 = lVar23 + 1) {
    if (*(char *)((long)pIVar16 + lVar23 + -0x2fa) == '\x01') {
      fVar51 = *(float *)((long)pIVar16 + lVar23 * 4 + -0xc14);
      *(bool *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x46) = fVar51 < 0.0;
      *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x3c) = 0;
      *(float *)((long)pIVar16 + lVar23 * 4 + -0xc00) = fVar51;
      if (0.0 <= fVar51) {
        *(float *)((long)pIVar16 + lVar23 * 4 + -0xc14) = fVar51 + (pIVar16->IO).DeltaTime;
        *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x41) = 0;
        uVar5 = *(undefined8 *)((long)pIVar16 + lVar23 * 8 + -0x1c8c);
        uVar6 = *(undefined8 *)((long)pIVar16 + lVar23 * 8 + -0x1c14);
        auVar58._0_4_ = IVar42.x - (float)uVar5;
        auVar58._4_4_ = IVar42.y - (float)((ulong)uVar5 >> 0x20);
        auVar58._8_8_ = 0;
        uVar14 = CONCAT44(auVar58._4_4_,auVar58._0_4_);
        auVar57._0_8_ = uVar14 ^ 0x8000000080000000;
        auVar57._8_4_ = 0x80000000;
        auVar57._12_4_ = 0x80000000;
        auVar54 = maxps(auVar57,auVar58);
        fVar51 = (float)uVar6;
        fVar46 = (float)((ulong)uVar6 >> 0x20);
        uVar38 = -(uint)(auVar54._0_4_ <= fVar51);
        uVar39 = -(uint)(auVar54._4_4_ <= fVar46);
        *(ulong *)((long)pIVar16 + lVar23 * 8 + -0x1c14) =
             CONCAT44(~uVar39 & (uint)auVar54._4_4_,~uVar38 & (uint)auVar54._0_4_) |
             CONCAT44((uint)fVar46 & uVar39,(uint)fVar51 & uVar38);
        fVar51 = *(float *)((long)pIVar16 + lVar23 * 4 + -0xbc4);
        fVar46 = auVar58._0_4_ * auVar58._0_4_ + auVar58._4_4_ * auVar58._4_4_;
        uVar38 = -(uint)(fVar46 <= fVar51);
        *(uint *)((long)pIVar16 + lVar23 * 4 + -0xbc4) =
             uVar38 & (uint)fVar51 | ~uVar38 & (uint)fVar46;
      }
      else {
        *(undefined4 *)((long)pIVar16 + lVar23 * 4 + -0xc14) = 0;
        *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x41) = 0;
        fVar51 = pIVar16->Time;
        if ((fVar51 - *(float *)((long)pIVar16 + lVar23 * 4 + -0xc3c) <
             (pIVar16->IO).MouseDoubleClickTime) &&
           (fVar40 = IVar42.x - *(float *)((long)pIVar16 + lVar23 * 8 + -0x1c8c),
           fVar47 = IVar42.y - *(float *)((long)pIVar16 + lVar23 * 8 + -0x1c88),
           fVar46 = (pIVar16->IO).MouseDoubleClickMaxDist, fVar51 = -3.4028235e+38,
           fVar40 * fVar40 + fVar47 * fVar47 < fVar46 * fVar46)) {
          *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x41) = 1;
          fVar51 = -3.4028235e+38;
        }
        *(float *)((long)pIVar16 + lVar23 * 4 + -0xc3c) = fVar51;
        *(ImVec2 *)((long)pIVar16 + lVar23 * 8 + -0x1c8c) = IVar42;
        *(undefined8 *)((long)pIVar16 + lVar23 * 8 + -0x1c14) = 0;
        *(undefined4 *)((long)pIVar16 + lVar23 * 4 + -0xbc4) = 0;
        if ((*(byte *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x46) & 1) != 0) {
          pIVar16->NavDisableMouseHover = false;
        }
      }
    }
    else {
      *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x46) = 0;
      fVar51 = *(float *)((long)pIVar16 + lVar23 * 4 + -0xc14);
      *(bool *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x3c) = 0.0 <= fVar51;
      *(float *)((long)pIVar16 + lVar23 * 4 + -0xc00) = fVar51;
      *(undefined4 *)((long)pIVar16 + lVar23 * 4 + -0xc14) = 0xbf800000;
      *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar23 + -0x41) = 0;
    }
  }
  fVar51 = (pIVar15->IO).DeltaTime;
  iVar29 = pIVar15->FramerateSecPerFrameIdx;
  pIVar15->FramerateSecPerFrameAccum =
       (fVar51 - pIVar15->FramerateSecPerFrame[iVar29]) + pIVar15->FramerateSecPerFrameAccum;
  pIVar15->FramerateSecPerFrame[iVar29] = fVar51;
  pIVar15->FramerateSecPerFrameIdx = (iVar29 + 1) % 0x78;
  uVar38 = -(uint)(0.0 < pIVar15->FramerateSecPerFrameAccum);
  (pIVar15->IO).Framerate =
       (float)(~uVar38 & 0x7f7fffff |
              (uint)(1.0 / (pIVar15->FramerateSecPerFrameAccum / 120.0)) & uVar38);
  pIVar16 = GImGui;
  pIVar26 = GImGui->MovingWindow;
  if (pIVar26 == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (GImGui->ActiveIdWindow->MoveId == GImGui->ActiveId)) &&
       (GImGui->ActiveIdIsAlive = true, (pIVar16->IO).MouseDown[0] == false)) {
      ClearActiveID();
    }
  }
  else {
    GImGui->ActiveIdIsAlive = true;
    pIVar28 = pIVar26->RootWindow;
    if (pIVar28 == (ImGuiWindow *)0x0) {
      __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xd0a,"void ImGui::UpdateMovingWindow()");
    }
    if ((((pIVar16->IO).MouseDown[0] != true) ||
        (fVar51 = (pIVar16->IO).MousePos.x, fVar51 < -256000.0)) ||
       (fVar46 = (pIVar16->IO).MousePos.y, fVar46 < -256000.0)) {
      ClearActiveID();
      pIVar16->MovingWindow = (ImGuiWindow *)0x0;
    }
    else {
      rect_abs.Min.x = fVar51 - (pIVar16->ActiveIdClickOffset).x;
      rect_abs.Min.y = fVar46 - (pIVar16->ActiveIdClickOffset).y;
      fVar51 = (pIVar28->Pos).x;
      if ((fVar51 != rect_abs.Min.x) || (NAN(fVar51) || NAN(rect_abs.Min.x))) {
LAB_00170aa4:
        MarkIniSettingsDirty(pIVar28);
        ::SetWindowPos(pIVar28,&rect_abs.Min,1);
        pIVar26 = pIVar16->MovingWindow;
      }
      else {
        fVar51 = (pIVar28->Pos).y;
        if ((fVar51 != rect_abs.Min.y) || (NAN(fVar51) || NAN(rect_abs.Min.y))) goto LAB_00170aa4;
      }
      FocusWindow(pIVar26);
    }
  }
  NewFrameUpdateHoveredWindowAndCaptureFlags();
  pIVar26 = GetFrontMostPopupModal();
  if (pIVar26 == (ImGuiWindow *)0x0) {
    fVar51 = 0.0;
  }
  else {
    fVar51 = (pIVar15->IO).DeltaTime * 6.0 + pIVar15->ModalWindowDarkeningRatio;
    if (1.0 <= fVar51) {
      fVar51 = 1.0;
    }
  }
  pIVar15->ModalWindowDarkeningRatio = fVar51;
  pIVar15->MouseCursor = 0;
  pIVar15->WantTextInputNextFrame = -1;
  pIVar15->WantCaptureMouseNextFrame = -1;
  pIVar15->WantCaptureKeyboardNextFrame = -1;
  (pIVar15->PlatformImePos).x = 1.0;
  (pIVar15->PlatformImePos).y = 1.0;
  pIVar26 = pIVar15->HoveredWindow;
  if (((pIVar26 != (ImGuiWindow *)0x0) && (pIVar26->Collapsed == false)) &&
     ((fVar51 = (pIVar15->IO).MouseWheel, pIVar28 = pIVar26, fVar51 != 0.0 ||
      ((fVar46 = (pIVar15->IO).MouseWheelH, fVar46 != 0.0 || (NAN(fVar46))))))) {
    do {
      pIVar31 = pIVar28;
      uVar38 = pIVar31->Flags;
      if ((uVar38 & 0x1000218) != 0x1000010) break;
      pIVar28 = pIVar31->ParentWindow;
    } while (pIVar31->ParentWindow != (ImGuiWindow *)0x0);
    if ((fVar51 != 0.0) || (NAN(fVar51))) {
      if ((pIVar15->IO).KeyCtrl == true) {
        if ((pIVar15->IO).FontAllowUserScaling == true) {
          fVar46 = fVar51 * 0.1 + pIVar26->FontWindowScale;
          fVar51 = 2.5;
          if (fVar46 <= 2.5) {
            fVar51 = fVar46;
          }
          fVar51 = (float)(-(uint)(fVar46 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar46 < 0.5) & (uint)fVar51);
          fVar40 = fVar51 / pIVar26->FontWindowScale;
          pIVar26->FontWindowScale = fVar51;
          fVar47 = 1.0 - fVar40;
          uVar60._0_4_ = (pIVar26->Pos).x;
          uVar60._4_4_ = (pIVar26->Pos).y;
          uVar61._0_4_ = (pIVar26->Size).x;
          uVar61._4_4_ = (pIVar26->Size).y;
          fVar51 = (float)((ulong)uVar60 >> 0x20);
          fVar46 = (float)((ulong)uVar61 >> 0x20);
          IVar42 = (pIVar15->IO).MousePos;
          auVar56._8_8_ = uVar61;
          auVar56._0_8_ = uVar61;
          auVar50._0_4_ =
               (IVar42.x - (float)(undefined4)uVar60) * fVar47 * (float)(undefined4)uVar61;
          auVar50._4_4_ = (IVar42.y - fVar51) * fVar47 * fVar46;
          auVar50._8_4_ = (0.0 - (float)(undefined4)uVar61) * fVar47 * (float)(undefined4)uVar61;
          auVar50._12_4_ = (0.0 - fVar46) * fVar47 * fVar46;
          auVar54 = divps(auVar50,auVar56);
          IVar49.x = auVar54._0_4_ + (float)(undefined4)uVar60;
          IVar49.y = auVar54._4_4_ + fVar51;
          auVar13._4_8_ = uVar61;
          auVar13._0_4_ = fVar51 * fVar40;
          auVar45._0_8_ = auVar13._0_8_ << 0x20;
          auVar45._8_4_ = (float)(undefined4)uVar61 * fVar40;
          auVar45._12_4_ = fVar46 * fVar40;
          pIVar26->Pos = IVar49;
          pIVar26->Size = auVar45._8_8_;
          IVar44.x = (pIVar26->SizeFull).x * fVar40;
          IVar44.y = (pIVar26->SizeFull).y * fVar40;
          pIVar26->SizeFull = IVar44;
        }
      }
      else {
        if ((uVar38 & 0x210) != 0) goto LAB_00170b41;
        fVar40 = GImGui->FontBaseSize * pIVar31->FontWindowScale * 5.0;
        fVar46 = (pIVar31->WindowPadding).y;
        fVar47 = (fVar46 + fVar46 +
                 ((pIVar31->ContentsRegionRect).Max.y - (pIVar31->ContentsRegionRect).Min.y)) * 0.67
        ;
        fVar46 = (pIVar31->Scroll).y;
        if (fVar47 <= fVar40) {
          fVar40 = fVar47;
        }
        fVar47 = (pIVar31->DC).CursorMaxPos.y;
        fVar51 = fVar46 - fVar51 * (float)(int)fVar40;
        (pIVar31->Scroll).y = fVar51;
        (pIVar31->DC).CursorMaxPos.y = (fVar46 + fVar47) - fVar51;
      }
    }
    if ((uVar38 & 0x210) == 0) {
      fVar51 = (pIVar15->IO).MouseWheelH;
      if ((((fVar51 != 0.0) || (NAN(fVar51))) && ((pIVar15->IO).KeyCtrl == false)) &&
         ((pIVar26->Flags & 0x10) == 0)) {
        fVar46 = (pIVar26->Scroll).x;
        fVar40 = (pIVar26->DC).CursorMaxPos.x;
        fVar51 = fVar46 - fVar51 * GImGui->FontBaseSize * pIVar31->FontWindowScale;
        (pIVar26->Scroll).x = fVar51;
        (pIVar26->DC).CursorMaxPos.x = (fVar46 + fVar40) - fVar51;
      }
    }
  }
LAB_00170b41:
  if ((((pIVar15->ActiveId == 0) && (pIVar26 = pIVar15->NavWindow, pIVar26 != (ImGuiWindow *)0x0))
      && ((pIVar26->Active == true &&
          (((pIVar26->Flags & 0x40000) == 0 && ((pIVar15->IO).KeyCtrl == false)))))) &&
     (bVar19 = IsKeyPressedMap(0,false), bVar19)) {
    if ((pIVar15->NavId == 0) || (pIVar15->NavIdTabCounter == 0x7fffffff)) {
      iVar29 = -(uint)(pIVar15->IO).KeyShift;
    }
    else {
      iVar29 = pIVar15->NavIdTabCounter + (-(uint)(pIVar15->IO).KeyShift | 1) + 1;
    }
    pIVar15->NavWindow->FocusIdxTabRequestNext = iVar29;
  }
  pIVar15->NavIdTabCounter = 0x7fffffff;
  for (iVar29 = 0; iVar29 != (pIVar15->Windows).Size; iVar29 = iVar29 + 1) {
    ppIVar27 = ImVector<ImGuiWindow_*>::operator[](&pIVar15->Windows,iVar29);
    pIVar11 = *ppIVar27;
    pIVar11->WasActive = pIVar11->Active;
    pIVar11->Active = false;
    pIVar11->WriteAccessed = false;
  }
  if ((pIVar15->NavWindow != (ImGuiWindow *)0x0) && (pIVar15->NavWindow->WasActive == false)) {
    FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar15->CurrentWindowStack,0);
  ImVector<ImGuiPopupRef>::resize(&pIVar15->CurrentPopupStack,0);
  ClosePopupsOverWindow(pIVar15->NavWindow);
  pIVar15 = GImGui;
  (pIVar15->NextWindowData).SizeVal.x = 400.0;
  (pIVar15->NextWindowData).SizeVal.y = 400.0;
  (pIVar15->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();

    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}